

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorTables::AddFieldByStylizedNames
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  pointer puVar2;
  type puVar3;
  second_type local_70;
  char *local_68;
  undefined1 local_60 [8];
  PointerStringPair camelcase_key;
  char *local_40;
  undefined1 local_38 [8];
  PointerStringPair lowercase_key;
  void *parent;
  FieldDescriptor *field_local;
  FileDescriptorTables *this_local;
  
  parent = field;
  field_local = (FieldDescriptor *)this;
  lowercase_key.second.length_ = (size_type)FindParentForFieldsByMap(this,field);
  FieldDescriptor::lowercase_name_abi_cxx11_((FieldDescriptor *)parent);
  local_40 = (char *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>::
  pair<const_void_*&,_const_char_*,_true>
            ((pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> *)local_38,
             (void **)&lowercase_key.second.length_,&local_40);
  puVar2 = std::
           unique_ptr<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
           ::get(&this->fields_by_lowercase_name_tmp_);
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                    (puVar2,(first_type *)local_38,(second_type *)&parent);
  if (!bVar1) {
    puVar3 = std::
             unique_ptr<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
             ::operator*(&this->fields_by_lowercase_name_tmp_);
    camelcase_key.second.length_ =
         (size_type)
         FindPtrOrNull<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                   (puVar3,(first_type *)local_38);
    InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
              (&this->fields_by_lowercase_name_,(first_type *)local_38,
               (second_type *)&camelcase_key.second.length_);
  }
  FieldDescriptor::camelcase_name_abi_cxx11_((FieldDescriptor *)parent);
  local_68 = (char *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>::
  pair<const_void_*&,_const_char_*,_true>
            ((pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> *)local_60,
             (void **)&lowercase_key.second.length_,&local_68);
  puVar2 = std::
           unique_ptr<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
           ::get(&this->fields_by_camelcase_name_tmp_);
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                    (puVar2,(first_type *)local_60,(second_type *)&parent);
  if (!bVar1) {
    puVar3 = std::
             unique_ptr<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
             ::operator*(&this->fields_by_camelcase_name_tmp_);
    local_70 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                         (puVar3,(first_type *)local_60);
    InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
              (&this->fields_by_camelcase_name_,(first_type *)local_60,&local_70);
  }
  return;
}

Assistant:

void FileDescriptorTables::AddFieldByStylizedNames(
    const FieldDescriptor* field) {
  const void* parent = FindParentForFieldsByMap(field);

  // We want fields_by_{lower,camel}case_name_ to be lazily built, but
  // cross-link order determines which entry will be present in the case of a
  // conflict. So we use the temporary maps that get destroyed after
  // BuildFileImpl() to detect the conflicts, and only store the conflicts in
  // the map that will persist. We will then lazily populate the rest of the
  // entries from fields_by_number_.

  PointerStringPair lowercase_key(parent, field->lowercase_name().c_str());
  if (!InsertIfNotPresent(fields_by_lowercase_name_tmp_.get(),
                               lowercase_key, field)) {
    InsertIfNotPresent(
        &fields_by_lowercase_name_, lowercase_key,
        FindPtrOrNull(*fields_by_lowercase_name_tmp_, lowercase_key));
  }

  PointerStringPair camelcase_key(parent, field->camelcase_name().c_str());
  if (!InsertIfNotPresent(fields_by_camelcase_name_tmp_.get(),
                               camelcase_key, field)) {
    InsertIfNotPresent(
        &fields_by_camelcase_name_, camelcase_key,
        FindPtrOrNull(*fields_by_camelcase_name_tmp_, camelcase_key));
  }
}